

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_external_file_cache.cpp
# Opt level: O0

void duckdb::DuckDBExternalFileCacheFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  ulong uVar1;
  size_type sVar2;
  Value *pVVar3;
  DataChunk *in_RDX;
  idx_t col;
  value_type *entry;
  idx_t count;
  DuckDBExternalFileCacheData *data;
  Value *in_stack_fffffffffffffdf8;
  DataChunk *in_stack_fffffffffffffe00;
  idx_t in_stack_fffffffffffffe08;
  DataChunk *in_stack_fffffffffffffe10;
  DataChunk *this;
  undefined1 *in_stack_fffffffffffffe38;
  string *val;
  Value *this_00;
  undefined1 local_168 [64];
  undefined1 local_128 [144];
  string local_98 [3];
  idx_t local_38;
  reference local_30;
  DataChunk *local_28;
  DuckDBExternalFileCacheData *local_20;
  DataChunk *local_18;
  
  local_18 = in_RDX;
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->
            ((optional_ptr<duckdb::GlobalTableFunctionState,_true> *)in_stack_fffffffffffffe00);
  local_20 = GlobalTableFunctionState::Cast<duckdb::DuckDBExternalFileCacheData>
                       ((GlobalTableFunctionState *)in_stack_fffffffffffffe00);
  uVar1 = local_20->offset;
  sVar2 = ::std::
          vector<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_>::
          size(&(local_20->entries).
                super_vector<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_>
              );
  if (uVar1 < sVar2) {
    local_28 = (DataChunk *)0x0;
    while( true ) {
      this_00 = (Value *)local_20->offset;
      pVVar3 = (Value *)::std::
                        vector<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_>
                        ::size(&(local_20->entries).
                                super_vector<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_>
                              );
      if (pVVar3 <= this_00 || (DataChunk *)0x7ff < local_28) break;
      local_20->offset = local_20->offset + 1;
      local_30 = vector<duckdb::CachedFileInformation,_true>::operator[]
                           ((vector<duckdb::CachedFileInformation,_true> *)in_stack_fffffffffffffe00
                            ,(size_type)in_stack_fffffffffffffdf8);
      local_38 = 1;
      val = local_98;
      ::std::__cxx11::string::string((string *)val,(string *)local_30);
      Value::Value(this_00,val);
      DataChunk::SetValue(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                          (idx_t)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      Value::~Value((Value *)in_stack_fffffffffffffe00);
      ::std::__cxx11::string::~string((string *)local_98);
      local_38 = local_38 + 1;
      NumericCast<long,unsigned_long,void>(0x140a1b1);
      Value::BIGINT((int64_t)in_stack_fffffffffffffe38);
      DataChunk::SetValue(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                          (idx_t)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      Value::~Value((Value *)in_stack_fffffffffffffe00);
      local_38 = local_38 + 1;
      this = local_18;
      NumericCast<long,unsigned_long,void>(0x140a231);
      in_stack_fffffffffffffe38 = local_128;
      Value::BIGINT((int64_t)in_stack_fffffffffffffe38);
      DataChunk::SetValue(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                          (idx_t)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      Value::~Value((Value *)in_stack_fffffffffffffe00);
      in_stack_fffffffffffffe00 = local_18;
      in_stack_fffffffffffffe08 = local_38;
      in_stack_fffffffffffffe10 = local_28;
      local_38 = local_38 + 1;
      Value::Value((Value *)this,(int32_t)((ulong)local_168 >> 0x20));
      DataChunk::SetValue(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                          (idx_t)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      Value::~Value((Value *)in_stack_fffffffffffffe00);
      local_28 = (DataChunk *)
                 ((long)&(local_28->data).
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_start + 1);
    }
    DataChunk::SetCardinality(local_18,(idx_t)local_28);
  }
  return;
}

Assistant:

void DuckDBExternalFileCacheFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBExternalFileCacheData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = data.entries[data.offset++];
		// return values:
		idx_t col = 0;
		// path, VARCHAR
		output.SetValue(col++, count, entry.path);
		// nr_bytes, BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(entry.nr_bytes)));
		// location, BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(entry.location)));
		// loaded, BOOLEAN
		output.SetValue(col++, count, entry.loaded);
		count++;
	}
	output.SetCardinality(count);
}